

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O3

Index wasm::Bits::getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                (Expression *curr,DummyLocalInfoProvider *localInfoProvider)

{
  uintptr_t uVar1;
  ulong uVar2;
  BinaryOp BVar3;
  bool bVar4;
  Id IVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Index IVar9;
  Index IVar10;
  Expression *pEVar11;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  long local_40;
  Index local_34;
  
  local_34 = 0xffffffff;
  uVar6 = 1;
LAB_009d5cc7:
  IVar5 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
          _id;
  if (UnaryId < IVar5) {
    if (IVar5 < RefIsNullId) {
      if (IVar5 == BinaryId) {
        bVar4 = Binary::isRelational((Binary *)curr);
        goto LAB_009d5cf0;
      }
      goto LAB_009d5cfb;
    }
    if (IVar5 < RefTestId) {
      if ((IVar5 == RefIsNullId) || (IVar5 == RefEqId)) goto LAB_009d5e96;
      goto LAB_009d5cfb;
    }
    if (IVar5 == RefTestId) goto LAB_009d5e96;
    if (IVar5 != StringEqId) goto LAB_009d5cfb;
    if (((Binary *)curr)->op == AddInt32) goto LAB_009d5e96;
    goto switchD_009d5d1b_caseD_9;
  }
  if (IVar5 == UnaryId) {
    bVar4 = Unary::isRelational((Unary *)curr);
LAB_009d5cf0:
    if (bVar4 != false) goto LAB_009d5e96;
    IVar5 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
            _id;
  }
LAB_009d5cfb:
  if (IVar5 == LocalSetId) goto code_r0x009d5cff;
  switch(IVar5) {
  case LocalGetId:
    if (localInfoProvider == (DummyLocalInfoProvider *)0x0) {
      __assert_fail("localInfoProvider",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                    ,0x1c3,
                    "Index wasm::Bits::getMaxBits(Expression *, LocalInfoProvider *) [LocalInfoProvider = wasm::Bits::DummyLocalInfoProvider]"
                   );
    }
    uVar1 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
            type.id;
    uVar6 = 0x20;
    if (uVar1 == 2) goto LAB_009d5e96;
    if (uVar1 != 3) {
      handle_unreachable("type has no integer bit size",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x8e);
    }
switchD_009d5d33_caseD_1a:
    uVar6 = 0x40;
    goto LAB_009d5e96;
  case LoadId:
    local_50.i64 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).
                   super_Expression.type.id;
    if ((((5 < local_50.func.super_IString.str._M_len) ||
         ((0x32UL >> (local_50.func.super_IString.str._M_len & 0x3f) & 1) == 0)) &&
        (BVar3 = ((Binary *)curr)->op, uVar6 = wasm::Type::getByteSize((Type *)&local_50.func),
        (byte)(char)BVar3 < uVar6)) && (*(byte *)((long)&((Binary *)curr)->op + 1) == 0)) {
      uVar6 = (uint)(byte)(char)((Binary *)curr)->op << 3;
      goto LAB_009d5e96;
    }
  default:
switchD_009d5d1b_caseD_9:
    uVar2 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
            type.id;
    if (6 < uVar2) {
LAB_009d63c4:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    uVar6 = (int)uVar2 - 1;
    if (2 < uVar6) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x1d4);
    }
    uVar6 = *(uint *)(&DAT_00df92d8 + (ulong)uVar6 * 4);
LAB_009d5e96:
    if (uVar6 <= local_34) {
      return uVar6;
    }
    return local_34;
  case ConstId:
    uVar2 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
            type.id;
    if (uVar2 < 7) {
      iVar7 = (int)uVar2;
      if (iVar7 == 3) {
        Literal::countLeadingZeroes((Literal *)&local_50.func,(Literal *)&((Binary *)curr)->op);
        if (local_40 != 3) goto LAB_009d641a;
        iVar7 = 0x40;
      }
      else {
        if (iVar7 != 2) {
          handle_unreachable("invalid type",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                             ,0xa3);
        }
        Literal::countLeadingZeroes((Literal *)&local_50.func,(Literal *)&((Binary *)curr)->op);
        if (local_40 != 2) goto LAB_009d6439;
        iVar7 = 0x20;
      }
      Literal::~Literal((Literal *)&local_50.func);
      uVar6 = iVar7 - local_50._0_4_;
      goto LAB_009d5e96;
    }
    goto LAB_009d63c4;
  case UnaryId:
    switch(((Binary *)curr)->op) {
    case AddInt32:
    case MulInt32:
    case DivUInt32:
      uVar6 = 6;
      goto LAB_009d5e96;
    case SubInt32:
    case DivSInt32:
    case RemSInt32:
      uVar6 = 7;
      goto LAB_009d5e96;
    case RemUInt32:
    case AndInt32:
    case OrInt32:
    case XorInt32:
    case ShlInt32:
    case ShrSInt32:
    case ShrUInt32:
    case RotLInt32:
    case RotRInt32:
    case EqInt32:
    case NeInt32:
    case LtSInt32:
    case LtUInt32:
    case LeSInt32:
      goto switchD_009d5d1b_caseD_9;
    case LeUInt32:
    case GtSInt32:
      handle_unreachable("relationals handled before",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x1a2);
    case GtUInt32:
switchD_009d5dd3_caseD_16:
      IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        (((Binary *)curr)->left,localInfoProvider);
      bVar4 = IVar9 < 0x20;
      goto LAB_009d5f87;
    case GeSInt32:
    case GeUInt32:
      uVar6 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        (((Binary *)curr)->left,localInfoProvider);
      break;
    default:
      switch(((Binary *)curr)->op) {
      case GtUInt64:
        IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          (((Binary *)curr)->left,localInfoProvider);
        bVar4 = IVar9 < 8;
        goto LAB_009d5f9d;
      case GeSInt64:
        IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          (((Binary *)curr)->left,localInfoProvider);
        bVar4 = IVar9 < 0x10;
LAB_009d5f9d:
        uVar6 = 0x20;
        goto LAB_009d5fa2;
      case GeUInt64:
        IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          (((Binary *)curr)->left,localInfoProvider);
        bVar4 = IVar9 < 8;
        break;
      case AddFloat32:
        IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          (((Binary *)curr)->left,localInfoProvider);
        bVar4 = IVar9 < 0x10;
        break;
      case SubFloat32:
        goto switchD_009d5dd3_caseD_16;
      default:
        goto switchD_009d5d1b_caseD_9;
      }
LAB_009d5f87:
      uVar6 = 0x40;
LAB_009d5fa2:
      if (!bVar4) {
        IVar9 = uVar6;
      }
LAB_009d5fa5:
      if (IVar9 <= local_34) {
        return IVar9;
      }
      return local_34;
    }
    goto LAB_009d5f1d;
  case BinaryId:
    goto switchD_009d5d1b_caseD_10;
  }
code_r0x009d5cff:
  curr = ((Binary *)curr)->left;
  goto LAB_009d5cc7;
switchD_009d5d1b_caseD_10:
  switch(((Binary *)curr)->op) {
  case AddInt32:
    IVar10 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       (((Binary *)curr)->left,localInfoProvider);
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      (((Binary *)curr)->right,localInfoProvider);
    if (IVar9 < IVar10) {
      IVar9 = IVar10;
    }
    uVar6 = IVar9 + 1;
LAB_009d5f1d:
    if (local_34 <= uVar6) {
      uVar6 = local_34;
    }
    bVar4 = uVar6 < 0x20;
    uVar8 = 0x20;
LAB_009d5f2d:
    if (!bVar4) {
      uVar6 = uVar8;
    }
    return uVar6;
  case SubInt32:
  case RotLInt32:
  case RotRInt32:
    uVar6 = 0x20;
    goto LAB_009d5e96;
  case MulInt32:
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      (((Binary *)curr)->right,localInfoProvider);
    IVar10 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       (((Binary *)curr)->left,localInfoProvider);
    uVar6 = IVar10 + IVar9;
    goto LAB_009d5f1d;
  case DivSInt32:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x20;
    if ((pEVar11->_id != ConstId) ||
       (IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          (((Binary *)curr)->left,localInfoProvider), IVar9 == 0x20))
    goto LAB_009d5e96;
    if (*(long *)(pEVar11 + 2) != 2) {
LAB_009d6439:
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    if (*(int *)(pEVar11 + 1) < 0) goto LAB_009d5e96;
    goto LAB_009d6382;
  case DivUInt32:
  case DivUInt64:
    uVar6 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(((Binary *)curr)->left,localInfoProvider)
    ;
    if (((Binary *)curr)->right->_id == ConstId) {
      IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        (((Binary *)curr)->right,(DummyLocalInfoProvider *)0x0);
      uVar8 = (uVar6 - IVar9) + 1;
      if ((int)(uVar6 - IVar9) < 0) {
        uVar8 = 0;
      }
      if ((int)uVar8 < (int)uVar6) {
        uVar6 = uVar8;
      }
    }
    goto LAB_009d5e96;
  case RemSInt32:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x20;
    if ((pEVar11->_id != ConstId) ||
       (IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          (((Binary *)curr)->left,localInfoProvider), IVar9 == 0x20))
    goto LAB_009d5e96;
    if (*(long *)(pEVar11 + 2) != 2) goto LAB_009d6439;
    uVar8 = ceilLog2(*(uint32_t *)(pEVar11 + 1));
    goto LAB_009d6218;
  case RemUInt32:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x20;
    if (pEVar11->_id != ConstId) goto LAB_009d5e96;
    uVar6 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(((Binary *)curr)->left,localInfoProvider)
    ;
    if (*(long *)(pEVar11 + 2) != 2) goto LAB_009d6439;
    uVar8 = ceilLog2(*(uint32_t *)(pEVar11 + 1));
    goto LAB_009d60da;
  case AndInt32:
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(((Binary *)curr)->left,localInfoProvider)
    ;
    curr = ((Binary *)curr)->right;
    if (IVar9 <= local_34) {
      local_34 = IVar9;
    }
    goto LAB_009d5cc7;
  case OrInt32:
  case XorInt32:
  case OrInt64:
  case XorInt64:
    IVar10 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       (((Binary *)curr)->left,localInfoProvider);
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      (((Binary *)curr)->right,localInfoProvider);
    if (IVar9 < IVar10) {
      IVar9 = IVar10;
    }
    goto LAB_009d5fa5;
  case ShlInt32:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x20;
    if (pEVar11->_id != ConstId) goto LAB_009d5e96;
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(((Binary *)curr)->left,localInfoProvider)
    ;
    IVar10 = getEffectiveShifts(pEVar11);
    uVar8 = IVar10 + IVar9;
    bVar4 = uVar8 < 0x20;
    uVar6 = 0x20;
    break;
  case ShrSInt32:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x20;
    if ((pEVar11->_id != ConstId) ||
       (uVar8 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          (((Binary *)curr)->left,localInfoProvider), uVar8 == 0x20))
    goto LAB_009d5e96;
    goto LAB_009d62dd;
  case ShrUInt32:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x20;
    goto LAB_009d6311;
  case EqInt32:
  case NeInt32:
  case LtSInt32:
  case LtUInt32:
  case LeSInt32:
  case LeUInt32:
  case GtSInt32:
  case GtUInt32:
  case GeSInt32:
  case GeUInt32:
  case EqInt64:
  case NeInt64:
  case LtSInt64:
  case LtUInt64:
  case LeSInt64:
  case LeUInt64:
  case GtSInt64:
  case GtUInt64:
  case GeSInt64:
  case GeUInt64:
  case EqFloat32:
  case NeFloat32:
  case LtFloat32:
  case LeFloat32:
  case GtFloat32:
  case GeFloat32:
  case EqFloat64:
  case NeFloat64:
  case LtFloat64:
  case LeFloat64:
  case GtFloat64:
  case GeFloat64:
    handle_unreachable("relationals handled before",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                       ,0x192);
  case AddInt64:
    IVar10 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       (((Binary *)curr)->left,localInfoProvider);
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      (((Binary *)curr)->right,localInfoProvider);
    if (IVar9 < IVar10) {
      IVar9 = IVar10;
    }
    uVar6 = IVar9 + 1;
    goto LAB_009d6136;
  case SubInt64:
  case RotLInt64:
  case RotRInt64:
    goto switchD_009d5d33_caseD_1a;
  case MulInt64:
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      (((Binary *)curr)->right,localInfoProvider);
    IVar10 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       (((Binary *)curr)->left,localInfoProvider);
    uVar6 = IVar10 + IVar9;
LAB_009d6136:
    if (local_34 <= uVar6) {
      uVar6 = local_34;
    }
    bVar4 = uVar6 < 0x40;
    uVar8 = 0x40;
    goto LAB_009d5f2d;
  case DivSInt64:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x40;
    if ((pEVar11->_id != ConstId) ||
       (IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          (((Binary *)curr)->left,localInfoProvider), IVar9 == 0x40))
    goto LAB_009d5e96;
    if (*(long *)(pEVar11 + 2) != 3) {
LAB_009d641a:
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x129,"int64_t wasm::Literal::geti64() const");
    }
    if (*(long *)(pEVar11 + 1) < 0) goto LAB_009d5e96;
LAB_009d6382:
    IVar10 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(pEVar11,(DummyLocalInfoProvider *)0x0);
    uVar6 = (IVar9 - IVar10) + 1;
    if ((int)(IVar9 - IVar10) < 0) {
      uVar6 = 0;
    }
    if ((int)IVar9 <= (int)uVar6) {
      uVar6 = IVar9;
    }
    goto LAB_009d5e96;
  case RemSInt64:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x40;
    if ((pEVar11->_id != ConstId) ||
       (IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          (((Binary *)curr)->left,localInfoProvider), IVar9 == 0x40))
    goto LAB_009d5e96;
    if (*(long *)(pEVar11 + 2) != 3) goto LAB_009d641a;
    uVar8 = ceilLog2(*(uint64_t *)(pEVar11 + 1));
LAB_009d6218:
    uVar6 = IVar9;
    if (uVar8 < IVar9) {
      uVar6 = uVar8;
    }
    goto LAB_009d5e96;
  case RemUInt64:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x40;
    if (pEVar11->_id != ConstId) goto LAB_009d5e96;
    uVar6 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(((Binary *)curr)->left,localInfoProvider)
    ;
    if (*(long *)(pEVar11 + 2) != 3) goto LAB_009d641a;
    uVar8 = ceilLog2(*(uint64_t *)(pEVar11 + 1));
LAB_009d60da:
    bVar4 = uVar8 < uVar6;
    break;
  case AndInt64:
    IVar10 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       (((Binary *)curr)->left,localInfoProvider);
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      (((Binary *)curr)->right,localInfoProvider);
    if (IVar10 <= IVar9) {
      IVar9 = IVar10;
    }
    goto LAB_009d5fa5;
  case ShlInt64:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x40;
    if (pEVar11->_id != ConstId) goto LAB_009d5e96;
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(((Binary *)curr)->left,localInfoProvider)
    ;
    IVar10 = getEffectiveShifts(pEVar11);
    uVar8 = IVar10 + IVar9;
    bVar4 = uVar8 < 0x40;
    uVar6 = 0x40;
    break;
  case ShrSInt64:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x40;
    if ((pEVar11->_id != ConstId) ||
       (uVar8 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          (((Binary *)curr)->left,localInfoProvider), uVar8 == 0x40))
    goto LAB_009d5e96;
LAB_009d62dd:
    IVar9 = getEffectiveShifts(pEVar11);
    uVar6 = uVar8 - IVar9;
    bVar4 = uVar6 == 0;
    if (uVar8 < IVar9) {
      uVar6 = 0;
    }
    if (uVar8 < IVar9 || bVar4) {
      uVar6 = 0;
    }
    goto LAB_009d5e96;
  case ShrUInt64:
    pEVar11 = ((Binary *)curr)->right;
    uVar6 = 0x40;
LAB_009d6311:
    if (pEVar11->_id == ConstId) {
      IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        (((Binary *)curr)->left,localInfoProvider);
      IVar10 = getEffectiveShifts(pEVar11);
      uVar6 = IVar9 - IVar10;
      bVar4 = uVar6 == 0;
      if (IVar9 < IVar10) {
        uVar6 = 0;
      }
      if (IVar9 < IVar10 || bVar4) {
        uVar6 = 0;
      }
    }
    goto LAB_009d5e96;
  default:
    goto switchD_009d5d1b_caseD_9;
  }
  if (bVar4) {
    uVar6 = uVar8;
  }
  goto LAB_009d5e96;
}

Assistant:

Index getMaxBits(Expression* curr,
                 LocalInfoProvider* localInfoProvider = nullptr) {
  if (Properties::emitsBoolean(curr)) {
    return 1;
  }
  if (auto* c = curr->dynCast<Const>()) {
    switch (curr->type.getBasic()) {
      case Type::i32:
        return 32 - c->value.countLeadingZeroes().geti32();
      case Type::i64:
        return 64 - c->value.countLeadingZeroes().geti64();
      default:
        WASM_UNREACHABLE("invalid type");
    }
  } else if (auto* binary = curr->dynCast<Binary>()) {
    switch (binary->op) {
      // 32-bit
      case RotLInt32:
      case RotRInt32:
      case SubInt32:
        return 32;
      case AddInt32: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(32), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt32: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(32), maxBitsLeft + maxBitsRight);
      }
      case DivSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // If either side might be negative, then the result will be negative
          if (maxBitsLeft == 32 || c->value.geti32() < 0) {
            return 32;
          }
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return 32;
      }
      case DivUInt32: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return maxBitsLeft;
      }
      case RemSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 32) {
            return 32;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case RemUInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case AndInt32: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt32:
      case XorInt32: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt32: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          return std::min(Index(32),
                          getMaxBits(binary->left, localInfoProvider) +
                            Bits::getEffectiveShifts(shifts));
        }
        return 32;
      }
      case ShrUInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case ShrSInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 32) {
            return 32;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case RotLInt64:
      case RotRInt64:
      case SubInt64:
        return 64;
      case AddInt64: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(64), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt64: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(64), maxBitsLeft + maxBitsRight);
      }
      case DivSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left or right const value is negative
          if (maxBitsLeft == 64 || c->value.geti64() < 0) {
            return 64;
          }
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return 64;
      }
      case DivUInt64: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return maxBitsLeft;
      }
      case RemSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 64) {
            return 64;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case RemUInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case AndInt64: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt64:
      case XorInt64: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt64: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          return std::min(Index(64),
                          Bits::getEffectiveShifts(shifts) + maxBits);
        }
        return 64;
      }
      case ShrUInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      case ShrSInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 64) {
            return 64;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      // comparisons
      case EqInt32:
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case LeSInt32:
      case LeUInt32:
      case GtSInt32:
      case GtUInt32:
      case GeSInt32:
      case GeUInt32:

      case EqInt64:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case LeSInt64:
      case LeUInt64:
      case GtSInt64:
      case GtUInt64:
      case GeSInt64:
      case GeUInt64:

      case EqFloat32:
      case NeFloat32:
      case LtFloat32:
      case LeFloat32:
      case GtFloat32:
      case GeFloat32:

      case EqFloat64:
      case NeFloat64:
      case LtFloat64:
      case LeFloat64:
      case GtFloat64:
      case GeFloat64:
        WASM_UNREACHABLE("relationals handled before");
      default: {
      }
    }
  } else if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      case EqZInt32:
      case EqZInt64:
        WASM_UNREACHABLE("relationals handled before");
      case WrapInt64:
      case ExtendUInt32:
        return std::min(Index(32), getMaxBits(unary->value, localInfoProvider));
      case ExtendS8Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(32) : maxBits;
      }
      case ExtendS16Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(32) : maxBits;
      }
      case ExtendS8Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(64) : maxBits;
      }
      case ExtendS16Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(64) : maxBits;
      }
      case ExtendS32Int64:
      case ExtendSInt32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 32 ? Index(64) : maxBits;
      }
      default: {
      }
    }
  } else if (auto* set = curr->dynCast<LocalSet>()) {
    // a tee passes through the value
    return getMaxBits(set->value, localInfoProvider);
  } else if (auto* get = curr->dynCast<LocalGet>()) {
    // TODO: Should this be optional?
    assert(localInfoProvider);
    return localInfoProvider->getMaxBitsForLocal(get);
  } else if (auto* load = curr->dynCast<Load>()) {
    // if signed, then the sign-extension might fill all the bits
    // if unsigned, then we have a limit
    if (LoadUtils::isSignRelevant(load) && !load->signed_) {
      return 8 * load->bytes;
    }
  }
  switch (curr->type.getBasic()) {
    case Type::i32:
      return 32;
    case Type::i64:
      return 64;
    case Type::unreachable:
      return 64; // not interesting, but don't crash
    default:
      WASM_UNREACHABLE("invalid type");
  }
}